

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,SearchStatistics *statistics)

{
  ostream *poVar1;
  void *pvVar2;
  SearchStatistics *statistics_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Initial bounds: (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->initial_lb);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->initial_ub);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"Final bounds: (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->final_lb);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->final_ub);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"Time (CPU s): path / expansion / backup / total = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->time_path);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->time_node_expansion);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->time_backup);
  poVar1 = std::operator<<(poVar1," / ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,statistics->time_search);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"Trials: no. / max length = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_trials);
  poVar1 = std::operator<<(poVar1," / ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,statistics->longest_trial_length);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"# nodes: expanded / total / policy = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_expanded_nodes);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_tree_nodes);
  poVar1 = std::operator<<(poVar1," / ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,statistics->num_policy_nodes);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"# particles: initial / final / tree = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_particles_before_search);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_particles_after_search);
  poVar1 = std::operator<<(poVar1," / ");
  std::ostream::operator<<(poVar1,statistics->num_tree_particles);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const SearchStatistics& statistics) {
	os << "Initial bounds: (" << statistics.initial_lb << ", "
		<< statistics.initial_ub << ")" << endl;
	os << "Final bounds: (" << statistics.final_lb << ", "
		<< statistics.final_ub << ")" << endl;
	os << "Time (CPU s): path / expansion / backup / total = "
		<< statistics.time_path << " / " << statistics.time_node_expansion
		<< " / " << statistics.time_backup << " / " << statistics.time_search
		<< endl;
	os << "Trials: no. / max length = " << statistics.num_trials << " / "
		<< statistics.longest_trial_length << endl;
	os << "# nodes: expanded / total / policy = "
		<< statistics.num_expanded_nodes << " / " << statistics.num_tree_nodes
		<< " / " << statistics.num_policy_nodes << endl;
	os << "# particles: initial / final / tree = "
		<< statistics.num_particles_before_search << " / "
		<< statistics.num_particles_after_search << " / "
		<< statistics.num_tree_particles; // << endl;
	return os;
}